

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numfmt.cpp
# Opt level: O0

URegistryKey icu_63::NumberFormat::registerFactory(NumberFormatFactory *toAdopt,UErrorCode *status)

{
  int iVar1;
  ICULocaleService *pIVar2;
  NFFactory *this;
  undefined4 extraout_var;
  UErrorCode *size;
  NFFactory *local_58;
  NFFactory *tempnnf;
  ICULocaleService *service;
  UErrorCode *status_local;
  NumberFormatFactory *toAdopt_local;
  
  size = status;
  pIVar2 = getNumberFormatService();
  if (pIVar2 != (ICULocaleService *)0x0) {
    this = (NFFactory *)UMemory::operator_new((UMemory *)0x60,(size_t)size);
    local_58 = (NFFactory *)0x0;
    if (this != (NFFactory *)0x0) {
      NFFactory::NFFactory(this,toAdopt);
      local_58 = this;
    }
    if (local_58 != (NFFactory *)0x0) {
      iVar1 = (*(pIVar2->super_ICUService).super_ICUNotifier._vptr_ICUNotifier[9])
                        (pIVar2,local_58,status);
      return (URegistryKey)CONCAT44(extraout_var,iVar1);
    }
  }
  *status = U_MEMORY_ALLOCATION_ERROR;
  return (URegistryKey)0x0;
}

Assistant:

URegistryKey U_EXPORT2
NumberFormat::registerFactory(NumberFormatFactory* toAdopt, UErrorCode& status)
{
  ICULocaleService *service = getNumberFormatService();
  if (service) {
	  NFFactory *tempnnf = new NFFactory(toAdopt);
	  if (tempnnf != NULL) {
		  return service->registerFactory(tempnnf, status);
	  }
  }
  status = U_MEMORY_ALLOCATION_ERROR;
  return NULL;
}